

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_boundl_x86_64(CPUX86State *env,target_ulong a0,int v)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  
  uVar1 = cpu_ldl_data_ra_x86_64(env,a0,unaff_retaddr);
  uVar2 = cpu_ldl_data_ra_x86_64(env,a0 + 4,unaff_retaddr);
  if (((int)uVar1 <= v) && (v <= (int)uVar2)) {
    return;
  }
  if ((env->hflags & 0x2000000) != 0) {
    (env->bndcs_regs).sts = 0;
  }
  raise_exception_ra_x86_64(env,5,unaff_retaddr);
}

Assistant:

void helper_boundl(CPUX86State *env, target_ulong a0, int v)
{
    int low, high;

    low = cpu_ldl_data_ra(env, a0, GETPC());
    high = cpu_ldl_data_ra(env, a0 + 4, GETPC());
    if (v < low || v > high) {
        if (env->hflags & HF_MPX_EN_MASK) {
            env->bndcs_regs.sts = 0;
        }
        raise_exception_ra(env, EXCP05_BOUND, GETPC());
    }
}